

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

Node * makeAction(char *text)

{
  char *pcVar1;
  char *local_420;
  char *ptr;
  char name [1024];
  Node *node;
  char *text_local;
  
  name._1016_8_ = _newNode(8,0x38);
  if (thisRule != (Node *)0x0) {
    actionCount = actionCount + 1;
    sprintf((char *)&ptr,"_%d_%s",(ulong)(uint)actionCount,(thisRule->rule).name);
    pcVar1 = strdup((char *)&ptr);
    *(char **)(name._1016_8_ + 0x28) = pcVar1;
    pcVar1 = strdup(text);
    *(char **)(name._1016_8_ + 0x18) = pcVar1;
    *(Node **)(name._1016_8_ + 0x20) = actions;
    *(Node **)(name._1016_8_ + 0x30) = thisRule;
    actions = (Node *)name._1016_8_;
    for (local_420 = *(char **)(name._1016_8_ + 0x18); *local_420 != '\0'; local_420 = local_420 + 1
        ) {
      if ((*local_420 == '$') && (local_420[1] == '$')) {
        *local_420 = 'y';
        local_420[1] = 'y';
      }
    }
    return (Node *)name._1016_8_;
  }
  __assert_fail("thisRule",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x98,"Node *makeAction(char *)");
}

Assistant:

Node *makeAction(char *text)
{
  Node *node= newNode(Action);
  char name[1024];
  assert(thisRule);
  sprintf(name, "_%d_%s", ++actionCount, thisRule->rule.name);
  node->action.name= strdup(name);
  node->action.text= strdup(text);
  node->action.list= actions;
  node->action.rule= thisRule;
  actions= node;
  {
    char *ptr;
    for (ptr= node->action.text;  *ptr;  ++ptr)
      if ('$' == ptr[0] && '$' == ptr[1])
	ptr[1]= ptr[0]= 'y';
  }
  return node;
}